

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar2;
  pointer pcVar3;
  int iVar4;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar5;
  long lVar6;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **ppAVar7;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *toRemove;
  bool bVar8;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **indirect;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  path;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  local_68;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  local_48;
  
  ppAVar7 = &this->root;
  local_68.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ***)0x0;
  local_68.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ***)0x0;
  pAVar5 = this->root;
  bVar8 = pAVar5 == (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0;
  local_70 = ppAVar7;
  if (!bVar8) {
    do {
      __n = (pAVar5->value)._M_string_length;
      local_70 = ppAVar7;
      if ((__n == value->_M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pAVar5->value)._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n), iVar4 == 0)
          ))) {
        if (!bVar8) {
          if (local_68.
              super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_68.
              super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
            ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>**const&>
                      ((vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                        *)&local_68,
                       (iterator)
                       local_68.
                       super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *local_68.
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish = ppAVar7;
            local_68.
            super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar6 = (long)local_68.
                        super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          pAVar5 = *local_70;
          if ((pAVar5->left ==
               (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) &&
             (pAVar5->right ==
              (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0)) {
            pcVar3 = (pAVar5->value)._M_dataplus._M_p;
            paVar1 = &(pAVar5->value).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            operator_delete(pAVar5,0x38);
            *local_70 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0;
          }
          else {
            if (pAVar5->right !=
                (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              local_50 = *local_70;
              pAVar5 = local_50->right;
              if (pAVar5->left !=
                  (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) {
                do {
                  if (local_68.
                      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_68.
                      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                    ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>**const&>
                              ((vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                                *)&local_68,
                               (iterator)
                               local_68.
                               super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ***)&local_50);
                  }
                  else {
                    *local_68.
                     super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                     ._M_impl.super__Vector_impl_data._M_finish = &local_50->right;
                    local_68.
                    super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_68.
                         super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  ppAVar7 = &local_50->right;
                  local_50 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&(*ppAVar7)->left;
                  pAVar5 = (*ppAVar7)->left;
                } while (pAVar5->left !=
                         (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x0);
              }
              if (pAVar5 == (*local_70)->right) {
                pAVar5->left = (*local_70)->left;
                pAVar5 = *local_70;
                *local_70 = local_50->right;
                if (pAVar5 != (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x0) {
                  pcVar3 = (pAVar5->value)._M_dataplus._M_p;
                  paVar1 = &(pAVar5->value).field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3 != paVar1) {
                    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                  }
                  operator_delete(pAVar5,0x38);
                }
              }
              else {
                (*local_68.
                  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1])->left = pAVar5->right;
                pAVar5->left = (*local_70)->left;
                pAVar5->right = (*local_70)->right;
                pAVar2 = *local_70;
                if (pAVar2 != (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x0) {
                  pcVar3 = (pAVar2->value)._M_dataplus._M_p;
                  paVar1 = &(pAVar2->value).field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3 != paVar1) {
                    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                  }
                  operator_delete(pAVar2,0x38);
                }
                *local_70 = pAVar5;
                *(AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)((long)local_68.
                            super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar6) = pAVar5;
              }
LAB_001063d1:
              std::
              vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
              ::vector(&local_48,&local_68);
              balance(this,&local_48);
              if (local_48.
                  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              this->_size = this->_size + -1;
              break;
            }
            *local_70 = pAVar5->left;
            pcVar3 = (pAVar5->value)._M_dataplus._M_p;
            paVar1 = &(pAVar5->value).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            operator_delete(pAVar5,0x38);
          }
          local_68.
          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          goto LAB_001063d1;
        }
        break;
      }
      if (local_68.
          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
        ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>**const&>
                  ((vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                    *)&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.
         super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish = ppAVar7;
        local_68.
        super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar4 = std::__cxx11::string::compare((string *)&(*local_70)->value);
      ppAVar7 = &(*local_70)->right + (0 < iVar4);
      pAVar5 = *ppAVar7;
      bVar8 = pAVar5 == (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0;
      local_70 = ppAVar7;
    } while (!bVar8);
  }
  if (local_68.
      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::erase(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr and (*indirect)->value != value) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    if (*indirect == nullptr) {  // the value does not exist in tree
      return;                    // may be raising an Exception is more elegant
    }

    path.push_back(indirect);

    std::size_t index = path.size();

    if ((*indirect)->left == nullptr and (*indirect)->right == nullptr) {  // the node is leaf
      delete *indirect;                                                    // just delete node
      *indirect = nullptr;
      path.pop_back();  // pop the deleted node from path
    }

    else if ((*indirect)->right == nullptr) {  // only left child exists
      AVLTreeNode<T> *toRemove = *indirect;

      (*indirect) = (*indirect)->left;
      delete toRemove;

      path.pop_back();
    }

    else {  // right child exists
      AVLTreeNode<T> **successor = &((*indirect)->right);

      while ((*successor)->left != nullptr) {
        path.push_back(successor);
        successor = &((*successor)->left);
      }

      if (*successor == (*indirect)->right) {
        (*successor)->left = (*indirect)->left;

        AVLTreeNode<T> *toRemove = *indirect;
        *indirect = *successor;
        delete toRemove;
      }

      else {
        AVLTreeNode<T> *tmp = *path.back();
        AVLTreeNode<T> *suc = *successor;

        tmp->left = (*successor)->right;
        suc->left = (*indirect)->left;
        suc->right = (*indirect)->right;

        delete *indirect;
        *indirect = suc;
        path[index] = &(suc->right);
      }
    }

    balance(path);
    _size--;
  }